

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_query_exist_populated_several(planck_unit_test_t *tc)

{
  uint uVar1;
  bool bVar2;
  planck_unit_result_t pVar3;
  ion_status_t iVar4;
  ulong uVar5;
  ion_byte_t value [10];
  char find_value [10];
  ion_byte_t test_value [10];
  ion_skiplist_t skiplist;
  uint local_8c;
  char local_86 [10];
  char local_7c [10];
  char local_72 [10];
  ion_skiplist_t local_68;
  
  sl_initialize(&local_68,key_type_numeric_signed,4,10,7,1,4);
  local_68.super.compare = dictionary_compare_signed_value;
  local_8c = 0;
  uVar5 = 0;
  do {
    sprintf(local_72,"Find %d",uVar5);
    iVar4 = sl_insert(&local_68,&local_8c,local_72);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(iVar4.error == '\0'),0x326,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00102d22;
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar4 & 0xffffffff00000000) == 0x100000000),0x327,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00102d22;
    uVar5 = (ulong)(local_8c + 1);
    bVar2 = (int)local_8c < 99;
    local_8c = local_8c + 1;
  } while (bVar2);
  local_8c = 0;
  uVar5 = 0;
  while( true ) {
    sprintf(local_7c,"Find %d",uVar5);
    iVar4 = sl_get(&local_68,&local_8c,local_86);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(iVar4.error == '\0'),0x336,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') break;
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar4 & 0xffffffff00000000) == 0x100000000),0x337,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') break;
    pVar3 = planck_unit_assert_str_are_equal
                      (tc,local_86,local_7c,0x338,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                      );
    if (pVar3 == '\0') break;
    uVar1 = local_8c + 1;
    uVar5 = (ulong)uVar1;
    bVar2 = 0x62 < (int)local_8c;
    local_8c = uVar1;
    if (bVar2) {
      sl_destroy(&local_68);
      return;
    }
  }
LAB_00102d22:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_query_exist_populated_several(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t test_value[10];

	int i;

	for (i = 0; i < 100; i++) {
		sprintf((char *) test_value, "Find %d", i);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, test_value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	char		find_value[10];
	ion_byte_t	value[10];

	for (i = 0; i < 100; i++) {
		sprintf(find_value, "Find %d", i);

		ion_status_t status = sl_get(&skiplist, (ion_key_t) &i, value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, find_value);
	}

	sl_destroy(&skiplist);
}